

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_schema_sort(lyd_node *sibling,int recursive)

{
  int iVar1;
  lyd_node *plVar2;
  long *__base;
  lys_module *plVar3;
  lys_module *plVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lys_node *parent;
  lys_node *last;
  ulong uVar7;
  char *format;
  LY_ERR no;
  ly_ctx *ctx;
  long *plVar8;
  uint uVar9;
  int iVar10;
  ulong __nmemb;
  lyd_node *local_38;
  
  if (sibling == (lyd_node *)0x0) {
    format = "Invalid arguments (%s()).";
    no = LY_EINVAL;
    ctx = (ly_ctx *)0x0;
LAB_0016213c:
    ly_log(ctx,LY_LLERR,no,format,"lyd_schema_sort");
LAB_00162145:
    iVar10 = -1;
  }
  else {
    if (sibling->prev != sibling) {
      sibling = lyd_first_sibling(sibling);
      uVar9 = 0;
      for (plVar2 = sibling; plVar2 != (lyd_node *)0x0; plVar2 = plVar2->next) {
        uVar9 = uVar9 + 1;
      }
      __nmemb = (ulong)uVar9;
      __base = (long *)malloc(__nmemb << 4);
      if (__base == (long *)0x0) {
        ctx = sibling->schema->module->ctx;
        format = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        goto LAB_0016213c;
      }
      plVar5 = (lys_node *)0x0;
      local_38 = sibling;
      for (uVar7 = 0; uVar7 != __nmemb; uVar7 = uVar7 + 1) {
        *(undefined4 *)(__base + uVar7 * 2 + 1) = 0;
        if (plVar5 == (lys_node *)0x0) {
LAB_00162008:
          plVar6 = local_38->schema;
          while ((plVar5 = lys_parent(plVar6), plVar5 != (lys_node *)0x0 &&
                 (plVar5 = lys_parent(plVar6),
                 (plVar5->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
            plVar6 = lys_parent(plVar6);
          }
          plVar5 = lys_parent(plVar6);
          if (plVar5 == (lys_node *)0x0) {
            do {
              plVar5 = plVar6;
              plVar6 = plVar5->prev;
            } while (plVar5->prev->next != (lys_node *)0x0);
          }
          else {
            plVar5 = lys_parent(plVar6);
            plVar5 = plVar5->child;
          }
        }
        else {
          plVar3 = lyd_node_module(local_38);
          plVar4 = lys_node_module(plVar5);
          if (plVar3 != plVar4) goto LAB_00162008;
        }
        plVar8 = __base + uVar7 * 2;
        plVar6 = local_38->schema;
        last = (lys_node *)0x0;
        do {
          parent = lys_parent(plVar5);
          plVar3 = lys_node_module(plVar5);
          last = lys_getnext(last,parent,plVar3,0x100);
          if (last == (lys_node *)0x0) {
            ly_log(plVar5->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                   ,0x12e2);
            free(__base);
            goto LAB_00162145;
          }
          *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
        } while (last != plVar6);
        *plVar8 = (long)local_38;
        local_38 = local_38->next;
      }
      qsort(__base,__nmemb,0x10,lyd_node_pos_cmp);
      uVar7 = 0;
      while (uVar7 != __nmemb) {
        if (uVar7 == 0) {
          plVar2 = (lyd_node *)*__base;
          plVar8 = __base + (ulong)(uVar9 - 1) * 2;
          sibling = plVar2;
          if (plVar2->parent != (lyd_node *)0x0) {
            plVar2->parent->child = plVar2;
          }
        }
        else {
          plVar2 = (lyd_node *)__base[uVar7 * 2];
          plVar8 = __base + uVar7 * 2 + -2;
        }
        plVar2->prev = (lyd_node *)*plVar8;
        if (uVar7 < uVar9 - 1) {
          *(long *)(__base[uVar7 * 2] + 0x18) = __base[(uVar7 + 1) * 2];
          uVar7 = uVar7 + 1;
        }
        else {
          *(undefined8 *)(__base[uVar7 * 2] + 0x18) = 0;
          uVar7 = uVar7 + 1;
        }
      }
      free(__base);
    }
    iVar10 = 0;
    if (recursive != 0) {
      for (; sibling != (lyd_node *)0x0; sibling = sibling->next) {
        if ((((sibling->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
              LYS_UNKNOWN) && (sibling->child != (lyd_node *)0x0)) &&
           (iVar1 = lyd_schema_sort(sibling->child,recursive), iVar1 != 0)) {
          return -1;
        }
      }
    }
  }
  return iVar10;
}

Assistant:

API int
lyd_schema_sort(struct lyd_node *sibling, int recursive)
{
    uint32_t len, i;
    struct lyd_node *node;
    struct lys_node *first_ssibling = NULL;
    struct lyd_node_pos *array;

    if (!sibling) {
        LOGARG;
        return -1;
    }

    /* something actually to sort */
    if (sibling->prev != sibling) {

        /* find the beginning */
        sibling = lyd_first_sibling(sibling);

        /* count siblings */
        len = 0;
        for (node = sibling; node; node = node->next) {
            ++len;
        }

        array = malloc(len * sizeof *array);
        LY_CHECK_ERR_RETURN(!array, LOGMEM(sibling->schema->module->ctx), -1);

        /* fill arrays with positions and corresponding nodes */
        for (i = 0, node = sibling; i < len; ++i, node = node->next) {
            array[i].pos = 0;

            /* we need to repeat this for every module */
            if (!first_ssibling || (lyd_node_module(node) != lys_node_module(first_ssibling))) {
                /* find the data node schema parent */
                first_ssibling = node->schema;
                while (lys_parent(first_ssibling)
                        && (lys_parent(first_ssibling)->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                    first_ssibling = lys_parent(first_ssibling);
                }

                /* find the beginning */
                if (lys_parent(first_ssibling)) {
                    first_ssibling = lys_parent(first_ssibling)->child;
                } else {
                    while (first_ssibling->prev->next) {
                        first_ssibling = first_ssibling->prev;
                    }
                }
            }

            if (lys_module_node_pos_r(first_ssibling, node->schema, &array[i].pos)) {
                free(array);
                return -1;
            }

            array[i].node = node;
        }

        /* sort the arrays */
        qsort(array, len, sizeof *array, lyd_node_pos_cmp);

        /* adjust siblings based on the sorted array */
        for (i = 0; i < len; ++i) {
            /* parent child */
            if (i == 0) {
                /* adjust sibling so that it still points to the beginning */
                sibling = array[i].node;
                if (array[i].node->parent) {
                    array[i].node->parent->child = array[i].node;
                }
            }

            /* prev */
            if (i > 0) {
                array[i].node->prev = array[i - 1].node;
            } else {
                array[i].node->prev = array[len - 1].node;
            }

            /* next */
            if (i < len - 1) {
                array[i].node->next = array[i + 1].node;
            } else {
                array[i].node->next = NULL;
            }
        }
        free(array);
    }

    /* sort all the children recursively */
    if (recursive) {
        LY_TREE_FOR(sibling, node) {
            if ((node->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF))
                    && node->child && lyd_schema_sort(node->child, recursive)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}